

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::SetNodeVector
          (TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *this,hash_t size)

{
  Node *pNVar1;
  uint local_18;
  hash_t i;
  hash_t size_local;
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *this_local;
  
  this->Size = 1;
  while (this->Size < size) {
    this->Size = this->Size << 1;
  }
  pNVar1 = (Node *)M_Malloc_Dbg((ulong)this->Size * 0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                                ,0x33a);
  this->Nodes = pNVar1;
  this->LastFree = this->Nodes + this->Size;
  for (local_18 = 0; local_18 < this->Size; local_18 = local_18 + 1) {
    Node::SetNil(this->Nodes + local_18);
  }
  return;
}

Assistant:

void SetNodeVector(hash_t size)
	{
		// Round size up to nearest power of 2
		for (Size = 1; Size < size; Size <<= 1)
		{ }
		Nodes = (Node *)M_Malloc(Size * sizeof(Node));
		LastFree = &Nodes[Size];	/* all positions are free */
		for (hash_t i = 0; i < Size; ++i)
		{
			Nodes[i].SetNil();
		}
	}